

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraBmc.c
# Opt level: O2

int Fra_BmcNodesAreEqual(Aig_Obj_t *pObj0,Aig_Obj_t *pObj1)

{
  int iVar1;
  int *piVar2;
  Aig_Obj_t *pAVar3;
  ulong uVar4;
  int i;
  ulong uVar5;
  
  piVar2 = *(int **)((long)(pObj0->field_5).pData + 0x40);
  i = *piVar2;
  iVar1 = piVar2[2];
  while( true ) {
    if (iVar1 <= i) {
      return 1;
    }
    pAVar3 = Bmc_ObjFrames(pObj0,i);
    uVar5 = (ulong)pAVar3 & 0xfffffffffffffffe;
    pAVar3 = Bmc_ObjFrames(pObj1,i);
    uVar4 = (ulong)pAVar3 & 0xfffffffffffffffe;
    if ((uVar5 != uVar4) &&
       (1 < (*(ulong *)(*(long *)(*(long *)(*(long *)(uVar4 + 0x28) + 0x40) + 0x38) +
                       (long)*(int *)(uVar4 + 0x24) * 8) ^
            *(ulong *)(*(long *)(*(long *)(*(long *)(uVar5 + 0x28) + 0x40) + 0x38) +
                      (long)*(int *)(uVar5 + 0x24) * 8)))) break;
    i = i + 1;
  }
  return 0;
}

Assistant:

int Fra_BmcNodesAreEqual( Aig_Obj_t * pObj0, Aig_Obj_t * pObj1 )
{
    Fra_Man_t * p = (Fra_Man_t *)pObj0->pData;
    Aig_Obj_t * pObjFrames0, * pObjFrames1;
    Aig_Obj_t * pObjFraig0, * pObjFraig1;
    int i;
    for ( i = p->pBmc->nPref; i < p->pBmc->nFramesAll; i++ )
    {
        pObjFrames0 = Aig_Regular( Bmc_ObjFrames(pObj0, i) );
        pObjFrames1 = Aig_Regular( Bmc_ObjFrames(pObj1, i) );
        if ( pObjFrames0 == pObjFrames1 )
            continue;
        pObjFraig0 = Aig_Regular( Bmc_ObjFraig(pObjFrames0) );
        pObjFraig1 = Aig_Regular( Bmc_ObjFraig(pObjFrames1) );
        if ( pObjFraig0 != pObjFraig1 )
            return 0;
    }
    return 1;
}